

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O1

void vkt::texture::util::wrapCubemapEdge
               (IVec2 *coord,IVec2 *size,int faceNdx,IVec2 *newCoord,int *newFaceNdx)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int i;
  long lVar5;
  Vector<int,_2> res;
  IVec2 edgeOffset;
  int aiStack_10 [2];
  IVec2 edgeFactor;
  
  if (coord->m_data[1] < 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = 1;
    if (coord->m_data[0] < 1) {
      lVar2 = (ulong)(coord->m_data[1] == 0) + 2;
    }
  }
  lVar3 = (long)faceNdx * 0x10;
  iVar1 = *(int *)((anonymous_namespace)::adjacentEdges + lVar2 * 4 + lVar3);
  edgeFactor.m_data = *(int (*) [2])((anonymous_namespace)::edgeFactors + (long)iVar1 * 8);
  lVar5 = 0;
  do {
    (&edgeFactor)[-1].m_data[lVar5] = 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar5 = 0;
  do {
    res.m_data[lVar5] = size->m_data[lVar5] - (&edgeFactor)[-1].m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  edgeOffset.m_data[0] = 0;
  edgeOffset.m_data[1] = 0;
  lVar5 = 0;
  do {
    edgeOffset.m_data[lVar5] = res.m_data[lVar5] * edgeFactor.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  iVar4 = *(int *)((anonymous_namespace)::edgeComponent + lVar2 * 4);
  if (*(int *)((anonymous_namespace)::adjacentEdgeDirs + lVar2 * 4 + lVar3) < 1) {
    iVar4 = ~coord->m_data[iVar4] + size->m_data[iVar4];
  }
  else {
    iVar4 = coord->m_data[iVar4];
  }
  iVar1 = *(int *)((anonymous_namespace)::edgeComponent + (long)iVar1 * 4);
  newCoord->m_data[iVar1] = iVar4;
  newCoord->m_data[1 - iVar1] = 0;
  lVar5 = 0;
  do {
    newCoord->m_data[lVar5] = newCoord->m_data[lVar5] + edgeOffset.m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  *newFaceNdx = *(int *)((anonymous_namespace)::adjacentFaces + lVar2 * 4 + lVar3);
  return;
}

Assistant:

void wrapCubemapEdge (const IVec2&	coord,
					  const IVec2&	size,
					  const int		faceNdx,
					  IVec2&		newCoord,
					  int&			newFaceNdx)
{
	int edgeNdx = -1;

	if (coord[1] < 0)
	{
		edgeNdx = 0;
	}
	else if (coord[0] > 0)
	{
		edgeNdx = 1;
	}
	else if (coord[1] > 0)
	{
		edgeNdx = 2;
	}
	else
	{
		edgeNdx = 3;
	}

	const int		adjacentEdgeNdx = adjacentEdges[faceNdx][edgeNdx];
	const IVec2		edgeFactor		= IVec2(edgeFactors[adjacentEdgeNdx][0],
											edgeFactors[adjacentEdgeNdx][1]);
	const IVec2		edgeOffset		= edgeFactor * (size - IVec2(1));

	if (adjacentEdgeDirs[faceNdx][edgeNdx] > 0)
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] = coord[edgeComponent[edgeNdx]];
	}
	else
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] =
		    size[edgeComponent[edgeNdx]] - coord[edgeComponent[edgeNdx]] - 1;
	}

	newCoord[1 - edgeComponent[adjacentEdgeNdx]] = 0;
	newCoord += edgeOffset;

	newFaceNdx = adjacentFaces[faceNdx][edgeNdx];
}